

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

Color * __thiscall Color::confine(Color *__return_storage_ptr__,Color *this)

{
  double r;
  double g;
  double *pdVar1;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  Color *local_10;
  Color *this_local;
  
  local_18 = 1.0;
  local_10 = this;
  pdVar1 = std::min<double>(&this->r,&local_18);
  local_20 = 0.0;
  pdVar1 = std::max<double>(pdVar1,&local_20);
  r = *pdVar1;
  local_28 = 1.0;
  pdVar1 = std::min<double>(&this->g,&local_28);
  local_30 = 0.0;
  pdVar1 = std::max<double>(pdVar1,&local_30);
  g = *pdVar1;
  local_38 = 1.0;
  pdVar1 = std::min<double>(&this->b,&local_38);
  local_40 = 0.0;
  pdVar1 = std::max<double>(pdVar1,&local_40);
  Color(__return_storage_ptr__,r,g,*pdVar1);
  return __return_storage_ptr__;
}

Assistant:

Color Color::confine() const
{
    return Color(std::max(std::min(r, 1.0), 0.0), std::max(std::min(g, 1.0), 0.0), std::max(std::min(b, 1.0), 0.0));
}